

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void * la_xrealloc(void *ptr,size_t size,char *file,int line,char *func)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  void *pvVar4;
  size_t sVar5;
  void *pvVar6;
  byte bVar7;
  ulong uVar8;
  long *plVar9;
  
  pvVar4 = realloc(ptr,size);
  if (pvVar4 != (void *)0x0) {
    return pvVar4;
  }
  plVar9 = (long *)(ulong)(uint)line;
  la_xrealloc_cold_1();
  if ((file == (char *)0x0) || (sVar5 = strlen(file), sVar5 < 2)) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = (void *)(sVar5 >> 1);
    pvVar6 = la_xcalloc((size_t)pvVar4,1,
                        "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/util.c"
                        ,0x3d,"la_slurp_hexstring");
    *plVar9 = (long)pvVar6;
    if ((sVar5 & 0xfffffffffffffffe) != 0) {
      bVar3 = 0;
      uVar8 = 0;
      do {
        cVar2 = file[uVar8];
        bVar7 = cVar2 - 0x30;
        if (9 < bVar7) {
          if ((byte)(cVar2 + 0xbfU) < 6) {
            bVar7 = cVar2 - 0x37;
          }
          else {
            if (5 < (byte)(cVar2 + 0x9fU)) {
              return (void *)(uVar8 >> 1);
            }
            bVar7 = cVar2 + 0xa9;
          }
        }
        pbVar1 = (byte *)(*plVar9 + (uVar8 >> 1));
        *pbVar1 = *pbVar1 | bVar7 << (~bVar3 & 4);
        uVar8 = uVar8 + 1;
        bVar3 = bVar3 + 4;
      } while ((sVar5 & 0xfffffffffffffffe) != uVar8);
    }
  }
  return pvVar4;
}

Assistant:

void *la_xrealloc(void *ptr, size_t size, char const *file, int line, char const *func) {
	ptr = realloc(ptr, size);
	if(ptr == NULL) {
		fprintf(stderr, "%s:%d: %s(): realloc(%zu) failed: %s\n",
				file, line, func, size, strerror(errno));
		_exit(1);
	}
	return ptr;
}